

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void pstack::
     print_container<std::vector<std::unique_ptr<pstack::Dwarf::FDE,std::default_delete<pstack::Dwarf::FDE>>,std::allocator<std::unique_ptr<pstack::Dwarf::FDE,std::default_delete<pstack::Dwarf::FDE>>>>,pstack::Dwarf::CFI_const*const&>
               (ostream *os,long *container,CFI **ctx)

{
  unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *puVar1;
  ostream *os_00;
  char *pcVar2;
  unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *field;
  unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *puVar3;
  JSON<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_const_pstack::Dwarf::CFI_*>
  local_40;
  
  std::operator<<(os,"[ ");
  puVar1 = (unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *)container[1];
  pcVar2 = "";
  for (puVar3 = (unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *)
                *container; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    os_00 = std::operator<<(os,pcVar2);
    local_40.object = puVar3;
    local_40.context = ctx;
    operator<<(os_00,&local_40);
    pcVar2 = ",\n";
  }
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}